

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneDiffer.cpp
# Opt level: O3

string * __thiscall
Assimp::dumpVector3_abi_cxx11_(string *__return_storage_ptr__,Assimp *this,aiVector3D *toDump)

{
  ostream *poVar1;
  string *psVar2;
  stringstream stream;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"( ",2);
  poVar1 = std::ostream::_M_insert<double>((double)*(float *)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)*(float *)(this + 4));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)*(float *)(this + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  psVar2 = (string *)std::ios_base::~ios_base(local_120);
  return psVar2;
}

Assistant:

static std::string dumpVector3( const aiVector3D &toDump ) {
    std::stringstream stream;
    stream << "( " << toDump.x << ", " << toDump.y << ", " << toDump.z << ")";
    return stream.str();
}